

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aec.c
# Opt level: O0

int get_param(uint *param,int *iarg,char **argv)

{
  int iVar1;
  size_t sVar2;
  long in_RDX;
  int *in_RSI;
  int *in_RDI;
  
  sVar2 = strlen(*(char **)(in_RDX + (long)*in_RSI * 8));
  if (sVar2 == 2) {
    *in_RSI = *in_RSI + 1;
    if (**(char **)(in_RDX + (long)*in_RSI * 8) == '-') {
      return 1;
    }
    iVar1 = atoi(*(char **)(in_RDX + (long)*in_RSI * 8));
    *in_RDI = iVar1;
  }
  else {
    iVar1 = atoi((char *)(*(long *)(in_RDX + (long)*in_RSI * 8) + 2));
    *in_RDI = iVar1;
  }
  return 0;
}

Assistant:

int get_param(unsigned int *param, int *iarg, char *argv[])
{
    if (strlen(argv[*iarg]) == 2) {
        (*iarg)++;
        if (argv[*iarg][0] == '-')
            return 1;
        else
            *param = atoi(argv[*iarg]);
    } else {
        *param = atoi(&argv[*iarg][2]);
    }
    return 0;
}